

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  ulong uVar3;
  void *__s;
  xpath_node *pxVar4;
  xpath_node *pxVar5;
  xpath_node *pxVar6;
  xml_node_struct *pxVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  xpath_allocator_capture cr;
  xpath_allocator_capture local_40;
  
  if ((this->_type == type_unsorted) &&
     (uVar3 = (long)this->_end - (long)this->_begin, 0x20 < (long)uVar3)) {
    local_40._state._root = alloc->_root;
    local_40._state._root_size = alloc->_root_size;
    local_40._state._error = alloc->_error;
    uVar11 = 1;
    do {
      uVar12 = uVar11;
      uVar11 = uVar12 * 2;
    } while (uVar12 < (uVar3 >> 5) + (uVar3 >> 4));
    local_40._target = alloc;
    __s = xpath_allocator::allocate(alloc,uVar12 * 8);
    if (__s != (void *)0x0) {
      memset(__s,0,uVar12 * 8);
      pxVar4 = this->_begin;
      pxVar5 = pxVar4;
      if (pxVar4 != this->_end) {
        uVar12 = uVar12 - 1;
        do {
          pxVar7 = (xml_node_struct *)(pxVar4->_attribute)._attr;
          if (pxVar7 == (xml_node_struct *)0x0) {
            pxVar7 = (pxVar4->_node)._root;
          }
          if (pxVar7 != (xml_node_struct *)0x0) {
            uVar9 = ((uint)((ulong)pxVar7 >> 0x10) & 0xffff ^ (uint)pxVar7) * -0x7a143595;
            uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
            uVar3 = (ulong)((uVar9 >> 0x10 ^ uVar9) & (uint)uVar12);
            bVar10 = false;
            uVar11 = 0;
            do {
              pxVar1 = *(xml_node_struct **)((long)__s + uVar3 * 8);
              if (pxVar1 == (xml_node_struct *)0x0) {
                *(xml_node_struct **)((long)__s + uVar3 * 8) = pxVar7;
                break;
              }
              if (pxVar1 == pxVar7) break;
              lVar8 = uVar11 + 1;
              uVar11 = uVar11 + 1;
              uVar3 = lVar8 + uVar3 & uVar12;
              bVar10 = uVar12 < uVar11;
            } while (uVar11 <= uVar12);
            if (bVar10) {
              __assert_fail("false && \"Hash table is full\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                            ,0x1d88,
                            "bool pugi::impl::(anonymous namespace)::hash_insert(const void **, size_t, const void *)"
                           );
            }
            if (pxVar1 == (xml_node_struct *)0x0) {
              pxVar2 = (pxVar4->_attribute)._attr;
              (pxVar5->_node)._root = (pxVar4->_node)._root;
              (pxVar5->_attribute)._attr = pxVar2;
              pxVar5 = pxVar5 + 1;
            }
          }
          pxVar4 = pxVar4 + 1;
        } while (pxVar4 != this->_end);
      }
      this->_end = pxVar5;
    }
    xpath_allocator_capture::~xpath_allocator_capture(&local_40);
  }
  else {
    pxVar4 = this->_end;
    lVar8 = (long)pxVar4 - (long)this->_begin;
    pxVar5 = this->_begin + 1;
    do {
      pxVar6 = pxVar5;
      if (lVar8 < 0x11) break;
      lVar8 = lVar8 + -0x10;
      pxVar5 = pxVar6 + 1;
    } while ((pxVar6[-1]._node._root != (pxVar6->_node)._root) ||
            (pxVar6[-1]._attribute._attr != (pxVar6->_attribute)._attr));
    pxVar5 = pxVar6 + -1;
    if (pxVar5 != pxVar4) {
      for (; pxVar6 != pxVar4; pxVar6 = pxVar6 + 1) {
        if (((pxVar6->_node)._root != (pxVar5->_node)._root) ||
           ((pxVar6->_attribute)._attr != (pxVar5->_attribute)._attr)) {
          pxVar2 = (pxVar6->_attribute)._attr;
          pxVar5[1]._node._root = (pxVar6->_node)._root;
          pxVar5[1]._attribute._attr = pxVar2;
          pxVar5 = pxVar5 + 1;
        }
      }
      pxVar5 = pxVar5 + 1;
    }
    this->_end = pxVar5;
  }
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}